

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31cShaderImageLoadStoreTests.cpp
# Opt level: O1

string * __thiscall
glcts::anon_unknown_0::AtomicMachine::GenShader<unsigned_int>
          (string *__return_storage_ptr__,AtomicMachine *this,int target,int stage,
          GLenum internalformat)

{
  string *psVar1;
  ostringstream os;
  ostream local_1a8;
  
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_1a8);
  std::__ostream_insert<char,std::char_traits<char>>(&local_1a8,"\n#define KSIZE 100",0x12);
  if (target == 4) {
    std::__ostream_insert<char,std::char_traits<char>>
              (&local_1a8,"\nlayout(local_size_x = KSIZE) in;",0x21);
  }
  psVar1 = (string *)
           (*(code *)(&DAT_01b45580 + *(int *)(&DAT_01b45580 + ((ulong)this & 0xffffffff) * 4)))();
  return psVar1;
}

Assistant:

std::string GenShader(int target, int stage, GLenum internalformat)
	{
		std::ostringstream os;
		os << NL "#define KSIZE 100";
		if (stage == 4)
		{ // CS
			os << NL "layout(local_size_x = KSIZE) in;";
		}
		switch (target)
		{
		case T2D:
			os << NL "layout(" << FormatEnumToString(internalformat) << ", binding = 1) coherent uniform "
			   << TypePrefix<T>() << "image2D g_image_2d;";
			break;
		case T3D:
			os << NL "layout(" << FormatEnumToString(internalformat) << ", binding = 2) coherent uniform "
			   << TypePrefix<T>() << "image3D g_image_3d;";
			break;
		case TCM:
			os << NL "layout(" << FormatEnumToString(internalformat) << ", binding = 0) coherent uniform "
			   << TypePrefix<T>() << "imageCube g_image_cube;";
			break;
		case T2DA:
			os << NL "layout(" << FormatEnumToString(internalformat) << ", binding = 3) coherent uniform "
			   << TypePrefix<T>() << "image2DArray g_image_2darray;";
			break;
		}
		os << NL "layout(std430) buffer out_data {" NL "  ivec4 o_color[KSIZE];" NL "} r;" NL << TypePrefix<T>()
		   << "vec2 t(int i) {" NL "  return " << TypePrefix<T>()
		   << "vec2(i);" NL "}" NL "void main() {" NL "  int g_value[6] = int[](r.o_color[0].x, r.o_color[0].y+1, "
			  "r.o_color[0].z+2, r.o_color[0].w+3, r.o_color[1].r+4, "
			  "r.o_color[1].g+5);";
		if (stage == 0)
		{ // VS
			os << NL "  ivec2 coord = ivec2(gl_VertexID, g_value[0]);";
		}
		else if (stage == 4)
		{ // CS
			os << NL "  ivec2 coord = ivec2(gl_GlobalInvocationID.x, g_value[0]);";
		}
		os << NL "  ivec4 o_color = ivec4(0, 1, 0, 1);";
		switch (target)
		{
		case T2D:
			os << NL "  ivec4 i = ivec4(1, 0, 0, 2);" NL "  imageAtomicExchange(g_image_2d, coord, t(0).x);" NL
					 "  if (imageAtomicAdd(g_image_2d, coord, t(2).x) != t(0).x) o_color = i;" NL
					 "  if (imageAtomicMin(g_image_2d, coord, t(3).x) != t(2).x) o_color = i;" NL
					 "  if (imageAtomicMax(g_image_2d, coord, t(4).x) != t(2).x) o_color = i;" NL
					 "  if (imageAtomicAnd(g_image_2d, coord, t(0).x) != t(4).x) o_color = i;" NL
					 "  if (imageAtomicOr(g_image_2d, coord, t(7).x) != t(0).x) o_color = i;" NL
					 "  if (imageAtomicXor(g_image_2d, coord, t(4).x) != t(7).x) o_color = i;" NL
					 "  if (imageAtomicExchange(g_image_2d, coord, t(1).x) != t(3).x) o_color = i;" NL
					 "  if (imageAtomicCompSwap(g_image_2d, coord, t(1).x, t(6).x) != t(1).x) o_color = i;" NL
					 "  if (imageAtomicExchange(g_image_2d, coord, t(0).x) != t(6).x) o_color = i;";
			break;
		case T3D:
			os << NL "  ivec4 i = ivec4(1, 0, 0, 3);" NL
					 "  imageAtomicExchange(g_image_3d, ivec3(coord, 0), t(0).x);" NL
					 "  if (imageAtomicAdd(g_image_3d, ivec3(coord, 0), t(2).x) != t(0).x) o_color = i;" NL
					 "  if (imageAtomicMin(g_image_3d, ivec3(coord, 0), t(3).x) != t(2).x) o_color = i;" NL
					 "  if (imageAtomicMax(g_image_3d, ivec3(coord, g_value[0]), t(4).x) != t(2).x) o_color = i;" NL
					 "  if (imageAtomicAnd(g_image_3d, ivec3(coord, 0), t(0).x) != t(4).x) o_color = i;" NL
					 "  if (imageAtomicOr(g_image_3d, ivec3(coord, 0), t(7).x) != t(0).x) o_color = i;" NL
					 "  if (imageAtomicXor(g_image_3d, ivec3(coord, 0), t(4).x) != t(7).x) o_color = i;" NL
					 "  if (imageAtomicExchange(g_image_3d, ivec3(coord, 0), t(1).x) != t(3).x) o_color = i;" NL
					 "  if (imageAtomicCompSwap(g_image_3d, ivec3(coord, 0), t(1).x, t(6).x) != t(1).x) o_color = i;" NL
					 "  if (imageAtomicExchange(g_image_3d, ivec3(coord, 0), t(0).x) != t(6).x) o_color = i;";
			break;
		case TCM:
			os << NL
				"  ivec4 i = ivec4(1, 0, 0, 6);" NL "  imageAtomicExchange(g_image_cube, ivec3(coord, 0), t(0).x);" NL
				"  if (imageAtomicAdd(g_image_cube, ivec3(coord, 0), t(g_value[2]).x) != t(0).x) o_color = i;" NL
				"  if (imageAtomicMin(g_image_cube, ivec3(coord, 0), t(3).x) != t(2).x) o_color = i;" NL
				"  if (imageAtomicMax(g_image_cube, ivec3(coord, 0), t(4).x) != t(2).x) o_color = i;" NL
				"  if (imageAtomicAnd(g_image_cube, ivec3(coord, 0), t(0).x) != t(4).x) o_color = i;" NL
				"  if (imageAtomicOr(g_image_cube, ivec3(coord, 0), t(7).x) != t(0).x) o_color = i;" NL
				"  if (imageAtomicXor(g_image_cube, ivec3(coord, 0), t(4).x) != t(7).x) o_color = i;" NL
				"  if (imageAtomicExchange(g_image_cube, ivec3(coord, 0), t(1).x) != t(3).x) o_color = i;" NL
				"  if (imageAtomicCompSwap(g_image_cube, ivec3(coord, g_value[0]), t(1).x, t(6).x) != t(1).x) o_color "
				"= i;" NL "  if (imageAtomicExchange(g_image_cube, ivec3(coord, 0), t(0).x) != t(6).x) o_color = i;";
			break;
		case T2DA:
			os << NL
				"  ivec4 i = ivec4(1, 0, 0, 23);" NL
				"  imageAtomicExchange(g_image_2darray, ivec3(coord, 0), t(0).x);" NL
				"  if (imageAtomicAdd(g_image_2darray, ivec3(coord, 0), t(2).x) != t(0).x) o_color = i;" NL
				"  if (imageAtomicMin(g_image_2darray, ivec3(coord, 0), t(3).x) != t(2).x) o_color = i;" NL
				"  if (imageAtomicMax(g_image_2darray, ivec3(coord, 0), t(4).x) != t(2).x) o_color = i;" NL
				"  if (imageAtomicAnd(g_image_2darray, ivec3(coord, 0), t(0).x) != t(4).x) o_color = i;" NL
				"  if (imageAtomicOr(g_image_2darray, ivec3(coord, 0), t(7).x) != t(0).x) o_color = i;" NL
				"  if (imageAtomicXor(g_image_2darray, ivec3(coord, 0), t(g_value[4]).x) != t(7).x) o_color = i;" NL
				"  if (imageAtomicExchange(g_image_2darray, ivec3(coord, 0), t(1).x) != t(3).x) o_color = i;" NL
				"  if (imageAtomicCompSwap(g_image_2darray, ivec3(coord, 0), t(1).x, t(6).x) != t(1).x) o_color = i;" NL
				"  if (imageAtomicExchange(g_image_2darray, ivec3(coord, 0), t(0).x) != t(6).x) o_color = i;";
			break;
		}
		os << NL "  r.o_color[coord.x] = o_color;" NL "}";
		return os.str();
	}